

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filter_block.cc
# Opt level: O1

bool __thiscall
leveldb::FilterBlockReader::KeyMayMatch(FilterBlockReader *this,uint64_t block_offset,Slice *key)

{
  uint uVar1;
  uint uVar2;
  char *pcVar3;
  undefined1 uVar4;
  int iVar5;
  ulong uVar6;
  bool bVar7;
  Slice filter;
  char *local_10;
  ulong local_8;
  
  uVar6 = block_offset >> ((byte)this->base_lg_ & 0x3f);
  if (uVar6 < this->num_) {
    pcVar3 = this->offset_;
    uVar1 = *(uint *)(pcVar3 + uVar6 * 4);
    uVar2 = *(uint *)(pcVar3 + uVar6 * 4 + 4);
    local_8 = (ulong)(uVar2 - uVar1);
    if ((uVar2 < uVar1) || ((ulong)((long)pcVar3 - (long)this->data_) < (ulong)uVar2)) {
      bVar7 = uVar2 != uVar1;
      uVar4 = 0;
    }
    else {
      local_10 = this->data_ + uVar1;
      iVar5 = (*this->policy_->_vptr_FilterPolicy[4])(this->policy_,key,&local_10);
      uVar4 = (undefined1)iVar5;
      bVar7 = false;
    }
    if (!bVar7) {
      return (bool)uVar4;
    }
  }
  return true;
}

Assistant:

bool FilterBlockReader::KeyMayMatch(uint64_t block_offset, const Slice& key) {
  uint64_t index = block_offset >> base_lg_;
  if (index < num_) {
    uint32_t start = DecodeFixed32(offset_ + index * 4);
    uint32_t limit = DecodeFixed32(offset_ + index * 4 + 4);
    if (start <= limit && limit <= static_cast<size_t>(offset_ - data_)) {
      Slice filter = Slice(data_ + start, limit - start);
      return policy_->KeyMayMatch(key, filter);
    } else if (start == limit) {
      // Empty filters do not match any keys
      return false;
    }
  }
  return true;  // Errors are treated as potential matches
}